

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O1

int run_test_threadpool_cancel_single(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  long *plVar3;
  long lVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_work_t req;
  long lStack_170;
  uv_sem_t uStack_168;
  uv_work_t uStack_148;
  uv_loop_t *puStack_c8;
  undefined8 uStack_b8;
  code *pcStack_b0;
  ulong local_a8;
  ulong local_a0;
  uv_work_t local_98;
  
  pcStack_b0 = (code *)0x1d126b;
  saturate_threadpool();
  pcStack_b0 = (code *)0x1d1270;
  puVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x1d128e;
  iVar1 = uv_queue_work(puVar2,&local_98,abort,nop_done_cb);
  local_a0 = (ulong)iVar1;
  local_a8 = 0;
  if (local_a0 == 0) {
    pcStack_b0 = (code *)0x1d12b6;
    iVar1 = uv_cancel((uv_req_t *)&local_98);
    local_a0 = (ulong)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d13be;
    local_a0 = (ulong)done_cb_called;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d13cb;
    lVar4 = 0;
    local_a0 = 0;
    do {
      pcStack_b0 = (code *)0x1d1309;
      uv_sem_post((uv_sem_t *)((long)pause_sems + lVar4));
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x80);
    pcStack_b0 = (code *)0x1d1320;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_a0 = (ulong)iVar1;
    local_a8 = 0;
    if (local_a0 != 0) goto LAB_001d13d8;
    local_a0 = 1;
    local_a8 = (ulong)done_cb_called;
    if (local_a8 != 1) goto LAB_001d13e5;
    pcStack_b0 = (code *)0x1d1371;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_b0 = (code *)0x1d137b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    local_a0 = 0;
    pcStack_b0 = (code *)0x1d138c;
    iVar1 = uv_loop_close(puVar2);
    local_a8 = (ulong)iVar1;
    if (local_a0 == local_a8) {
      pcStack_b0 = (code *)0x1d13a2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x1d13be;
    run_test_threadpool_cancel_single_cold_1();
LAB_001d13be:
    pcStack_b0 = (code *)0x1d13cb;
    run_test_threadpool_cancel_single_cold_2();
LAB_001d13cb:
    pcStack_b0 = (code *)0x1d13d8;
    run_test_threadpool_cancel_single_cold_3();
LAB_001d13d8:
    pcStack_b0 = (code *)0x1d13e5;
    run_test_threadpool_cancel_single_cold_4();
LAB_001d13e5:
    pcStack_b0 = (code *)0x1d13f2;
    run_test_threadpool_cancel_single_cold_5();
  }
  iVar1 = (int)&local_a8;
  pcStack_b0 = nop_done_cb;
  run_test_threadpool_cancel_single_cold_6();
  pcStack_b0 = (code *)(long)iVar1;
  uStack_b8 = 0xffffffffffffff83;
  if (pcStack_b0 == (code *)0xffffffffffffff83) {
    done_cb_called = done_cb_called + 1;
    return iVar1;
  }
  puStack_c8 = (uv_loop_t *)run_test_threadpool_cancel_when_busy;
  nop_done_cb_cold_1();
  uStack_148.data = &uStack_168;
  puStack_c8 = puVar2;
  iVar1 = uv_sem_init((uv_sem_t *)uStack_148.data,0);
  lStack_170 = (long)iVar1;
  if (lStack_170 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_queue_work(puVar2,&uStack_148,busy_cb,after_busy_cb);
    lStack_170 = (long)iVar1;
    if (lStack_170 != 0) goto LAB_001d15a1;
    uv_sem_wait(&uStack_168);
    iVar1 = uv_cancel((uv_req_t *)&uStack_148);
    lStack_170 = (long)iVar1;
    if (lStack_170 != -0x10) goto LAB_001d15ae;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_170 = (long)iVar1;
    if (lStack_170 != 0) goto LAB_001d15bb;
    lStack_170 = 1;
    if (done_cb_called == 1) {
      uv_sem_destroy(&uStack_168);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      lStack_170 = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (lStack_170 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d15d5;
    }
  }
  else {
    run_test_threadpool_cancel_when_busy_cold_1();
LAB_001d15a1:
    run_test_threadpool_cancel_when_busy_cold_2();
LAB_001d15ae:
    run_test_threadpool_cancel_when_busy_cold_3();
LAB_001d15bb:
    run_test_threadpool_cancel_when_busy_cold_4();
  }
  run_test_threadpool_cancel_when_busy_cold_5();
LAB_001d15d5:
  plVar3 = &lStack_170;
  run_test_threadpool_cancel_when_busy_cold_6();
  uv_sem_post((uv_sem_t *)*plVar3);
  uv_sleep(10);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(threadpool_cancel_single) {
  uv_loop_t* loop;
  uv_work_t req;

  saturate_threadpool();
  loop = uv_default_loop();
  ASSERT_OK(uv_queue_work(loop, &req, (uv_work_cb) abort, nop_done_cb));
  ASSERT_OK(uv_cancel((uv_req_t*) &req));
  ASSERT_OK(done_cb_called);
  unblock_threadpool();
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, done_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}